

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall
GEO::VariableObserverList::notify_observers(VariableObserverList *this,string *value)

{
  size_type sVar1;
  reference ppVVar2;
  ulong local_20;
  size_t i;
  string *value_local;
  VariableObserverList *this_local;
  
  if ((this->block_notify_ & 1U) == 0) {
    this->block_notify_ = true;
    for (local_20 = 0;
        sVar1 = std::vector<GEO::VariableObserver_*,_std::allocator<GEO::VariableObserver_*>_>::size
                          (&this->observers_), local_20 < sVar1; local_20 = local_20 + 1) {
      ppVVar2 = std::vector<GEO::VariableObserver_*,_std::allocator<GEO::VariableObserver_*>_>::
                operator[](&this->observers_,local_20);
      (**(*ppVVar2)->_vptr_VariableObserver)(*ppVVar2,value);
    }
    this->block_notify_ = false;
  }
  return;
}

Assistant:

void VariableObserverList::notify_observers(
        const std::string& value
    ) {
        if(block_notify_) {
            return;
        }
        block_notify_ = true;
        for(size_t i = 0; i < observers_.size(); i++) {
            observers_[i]->value_changed(value);
        }
        block_notify_ = false;
    }